

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O3

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
VisitPLTerm(ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
            *this,PLTerm e)

{
  ulong uVar1;
  Kind KVar2;
  BasicWriter<char> *pBVar3;
  Buffer<char> *pBVar4;
  char *pcVar5;
  size_t sVar6;
  Reference e_00;
  Kind KVar7;
  bool bVar8;
  double dVar9;
  ExprBase local_50;
  FormatSpec local_48;
  
  pBVar3 = this->writer_;
  pBVar4 = pBVar3->buffer_;
  sVar6 = pBVar4->size_;
  uVar1 = sVar6 + 2;
  local_50.impl_ =
       (Impl *)e.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.impl_;
  if (pBVar4->capacity_ < uVar1) {
    (**pBVar4->_vptr_Buffer)(pBVar4);
    sVar6 = pBVar4->size_;
  }
  pcVar5 = pBVar4->ptr_;
  (pcVar5 + sVar6)[0] = '<';
  (pcVar5 + sVar6)[1] = '<';
  pBVar4->size_ = uVar1;
  dVar9 = PLTerm::breakpoint((PLTerm *)&local_50,0);
  local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
  local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
  local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
  local_48.flags_ = 0;
  local_48.precision_ = -1;
  local_48.type_ = '\0';
  fmt::BasicWriter<char>::write_double<double>(pBVar3,dVar9,&local_48);
  KVar2 = local_50.impl_[1].kind_;
  if (1 < (int)KVar2) {
    KVar7 = FIRST_EXPR;
    do {
      pBVar3 = this->writer_;
      pBVar4 = pBVar3->buffer_;
      sVar6 = pBVar4->size_;
      uVar1 = sVar6 + 2;
      if (pBVar4->capacity_ < uVar1) {
        (**pBVar4->_vptr_Buffer)(pBVar4,uVar1);
        sVar6 = pBVar4->size_;
      }
      pcVar5 = pBVar4->ptr_;
      (pcVar5 + sVar6)[0] = ',';
      (pcVar5 + sVar6)[1] = ' ';
      pBVar4->size_ = uVar1;
      dVar9 = PLTerm::breakpoint((PLTerm *)&local_50,KVar7);
      local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
      local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
      local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
      local_48.flags_ = 0;
      local_48.precision_ = -1;
      local_48.type_ = '\0';
      fmt::BasicWriter<char>::write_double<double>(pBVar3,dVar9,&local_48);
      KVar7 = KVar7 + FIRST_EXPR;
    } while (KVar2 != KVar7);
  }
  pBVar3 = this->writer_;
  pBVar4 = pBVar3->buffer_;
  sVar6 = pBVar4->size_;
  uVar1 = sVar6 + 2;
  if (pBVar4->capacity_ < uVar1) {
    (**pBVar4->_vptr_Buffer)(pBVar4);
    sVar6 = pBVar4->size_;
  }
  pcVar5 = pBVar4->ptr_;
  (pcVar5 + sVar6)[0] = ';';
  (pcVar5 + sVar6)[1] = ' ';
  pBVar4->size_ = uVar1;
  dVar9 = PLTerm::slope((PLTerm *)&local_50,0);
  local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
  local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
  local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
  local_48.flags_ = 0;
  local_48.precision_ = -1;
  local_48.type_ = '\0';
  fmt::BasicWriter<char>::write_double<double>(pBVar3,dVar9,&local_48);
  KVar2 = local_50.impl_[1].kind_;
  if (0 < (int)KVar2) {
    KVar7 = FIRST_EXPR;
    do {
      pBVar3 = this->writer_;
      pBVar4 = pBVar3->buffer_;
      sVar6 = pBVar4->size_;
      uVar1 = sVar6 + 2;
      if (pBVar4->capacity_ < uVar1) {
        (**pBVar4->_vptr_Buffer)(pBVar4,uVar1);
        sVar6 = pBVar4->size_;
      }
      pcVar5 = pBVar4->ptr_;
      (pcVar5 + sVar6)[0] = ',';
      (pcVar5 + sVar6)[1] = ' ';
      pBVar4->size_ = uVar1;
      dVar9 = PLTerm::slope((PLTerm *)&local_50,KVar7);
      local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
      local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
      local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
      local_48.flags_ = 0;
      local_48.precision_ = -1;
      local_48.type_ = '\0';
      fmt::BasicWriter<char>::write_double<double>(pBVar3,dVar9,&local_48);
      bVar8 = KVar7 != KVar2;
      KVar7 = KVar7 + FIRST_EXPR;
    } while (bVar8);
  }
  pBVar4 = this->writer_->buffer_;
  sVar6 = pBVar4->size_;
  uVar1 = sVar6 + 3;
  if (pBVar4->capacity_ < uVar1) {
    (**pBVar4->_vptr_Buffer)(pBVar4,uVar1);
    sVar6 = pBVar4->size_;
  }
  pcVar5 = pBVar4->ptr_;
  pcVar5[sVar6 + 2] = ' ';
  pcVar5 = pcVar5 + sVar6;
  pcVar5[0] = '>';
  pcVar5[1] = '>';
  pBVar4->size_ = uVar1;
  e_00 = internal::ExprBase::Create<mp::Reference>(*(Impl **)(local_50.impl_ + 2));
  Visit(this,(NumericExpr)
             e_00.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_,-1);
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::VisitPLTerm(PLTerm e) {
  writer_ << "<<" << e.breakpoint(0);
  for (int i = 1, n = e.num_breakpoints(); i < n; ++i)
    writer_ << ", " << e.breakpoint(i);
  writer_ << "; " << e.slope(0);
  for (int i = 1, n = e.num_slopes(); i < n; ++i)
    writer_ << ", " << e.slope(i);
  writer_ << ">> ";
  Visit( e.arg() );
}